

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_sendf(Curl_easy *data,connectdata *conn,char *fmt,...)

{
  void *pp;
  char in_AL;
  int iVar1;
  uint uVar2;
  char *fmt_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  imap_conn *imapc;
  CURLcode result;
  char *fmt_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = &conn->proto;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  iVar1 = curlx_sltosi(conn->connection_id % 0x1a);
  uVar2 = *(int *)((long)ap[0].reg_save_area + 0xac) + 1;
  *(uint *)((long)ap[0].reg_save_area + 0xac) = uVar2;
  curl_msnprintf((conn->proto).imapc.resptag,5,"%c%03d",(ulong)(iVar1 + 0x41),(ulong)uVar2 % 1000);
  Curl_dyn_reset((dynbuf *)((long)ap[0].reg_save_area + 200));
  imapc._4_4_ = Curl_dyn_addf((dynbuf *)((long)ap[0].reg_save_area + 200),"%s %s",
                              (long)ap[0].reg_save_area + 0xb0,fmt);
  pp = ap[0].reg_save_area;
  if (imapc._4_4_ == CURLE_OK) {
    ap[0].overflow_arg_area = local_f8;
    ap[0]._0_8_ = &stack0x00000008;
    local_48._4_4_ = 0x30;
    local_48._0_4_ = 0x18;
    fmt_00 = Curl_dyn_ptr((dynbuf *)((long)ap[0].reg_save_area + 200));
    imapc._4_4_ = Curl_pp_vsendf(data,(pingpong *)pp,fmt_00,(__va_list_tag *)local_48);
  }
  return imapc._4_4_;
}

Assistant:

static CURLcode imap_sendf(struct Curl_easy *data,
                           struct connectdata *conn, const char *fmt, ...)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  DEBUGASSERT(fmt);

  /* Calculate the tag based on the connection ID and command ID */
  msnprintf(imapc->resptag, sizeof(imapc->resptag), "%c%03d",
            'A' + curlx_sltosi(conn->connection_id % 26),
            (++imapc->cmdid)%1000);

  /* start with a blank buffer */
  Curl_dyn_reset(&imapc->dyn);

  /* append tag + space + fmt */
  result = Curl_dyn_addf(&imapc->dyn, "%s %s", imapc->resptag, fmt);
  if(!result) {
    va_list ap;
    va_start(ap, fmt);
    result = Curl_pp_vsendf(data, &imapc->pp, Curl_dyn_ptr(&imapc->dyn), ap);
    va_end(ap);
  }
  return result;
}